

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O1

int64_t interpolation_filter_rd
                  (MACROBLOCK *x,AV1_COMP *cpi,TileDataEnc *tile_data,BLOCK_SIZE bsize,
                  BUFFER_SET *orig_dst,int64_t *rd,RD_STATS *rd_stats_luma,RD_STATS *rd_stats,
                  int *switchable_rate,BUFFER_SET **dst_bufs,int filter_idx,int *switchable_ctx,
                  int skip_pred)

{
  MACROBLOCKD *pMVar1;
  uint8_t uVar2;
  int_interpfilters iVar3;
  undefined8 *puVar4;
  macroblockd_plane *pmVar5;
  BLOCK_SIZE BVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  undefined7 in_register_00000009;
  ulong uVar13;
  long lVar14;
  buf_2d *pbVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  undefined8 uVar20;
  MB_MODE_INFO *pMVar21;
  int iVar22;
  byte bVar23;
  uint plane_from;
  uint8_t *puVar24;
  undefined4 in_stack_0000002c;
  uint8_t local_111;
  int local_110;
  undefined4 uStack_104;
  undefined3 uStack_100;
  int local_fc;
  long local_f8;
  long local_f0;
  long local_d8;
  undefined8 local_c8;
  int64_t iStack_c0;
  undefined8 uStack_b8;
  int64_t iStack_b0;
  undefined8 local_a8;
  MB_MODE_INFO *local_a0;
  BUFFER_SET *local_98;
  AV1_COMP *local_90;
  uint8_t *local_88;
  int64_t *local_80;
  ulong local_78;
  long local_70;
  long local_68;
  ulong local_60;
  long local_58;
  uint local_4c;
  MACROBLOCKD *local_48;
  AV1_COMMON *local_40;
  BUFFER_SET *local_38;
  
  local_38 = (BUFFER_SET *)CONCAT71(in_register_00000009,bsize);
  local_88 = (uint8_t *)CONCAT44(local_88._4_4_,(int)tile_data);
  puVar24 = local_88;
  uVar2 = ((cpi->common).seq_params)->monochrome;
  pMVar21 = *(x->e_mbd).mi;
  local_c8._0_4_ = (int)*rd;
  local_110 = *(int *)((long)rd + 4);
  local_d8 = rd[1];
  local_f8 = rd[2];
  local_f0 = rd[3];
  uVar13 = (ulong)*(byte *)(rd + 4);
  uStack_100 = (undefined3)((uint)*(undefined4 *)((long)rd + 0x24) >> 8);
  uStack_104 = *(undefined4 *)((long)rd + 0x21);
  uVar17 = filter_sets[(ulong)dst_bufs & 0xffffffff].as_int;
  iVar3 = pMVar21->interp_filters;
  (pMVar21->interp_filters).as_int = uVar17;
  iVar22 = (x->mode_costs).switchable_interp_costs[*(int *)CONCAT44(in_stack_0000002c,filter_idx)]
           [uVar17 & 0xff];
  if (((cpi->common).seq_params)->enable_dual_filter != '\0') {
    iVar22 = iVar22 + *(int *)((long)(x->mode_costs).switchable_interp_costs
                                     [((int *)CONCAT44(in_stack_0000002c,filter_idx))[1]] +
                              (ulong)(uVar17 >> 0xe & 0x3fc));
  }
  if ((long)orig_dst->plane[0] < (long)x->rdmult * (long)iVar22 + 0x100 >> 9) {
    pMVar21->interp_filters = iVar3;
  }
  else {
    uVar17 = (uint)(uVar2 == '\0') * 2 + 1;
    uVar11 = 3;
    if ((cpi->interp_search_flags).default_interp_skip_flags != (int)switchable_ctx) {
      uVar11 = (ulong)switchable_ctx & 0xffffffff;
    }
    iVar10 = (int)uVar11;
    local_80 = rd;
    if (iVar10 == 3) {
      local_c8._0_4_ = rd_stats_luma->rate;
      local_110 = rd_stats_luma->zero_rate;
      local_d8 = rd_stats_luma->dist;
      local_f8 = rd_stats_luma->rdcost;
      local_f0 = rd_stats_luma->sse;
      local_111 = rd_stats_luma->skip_txfm;
      uStack_100 = (undefined3)((uint)*(undefined4 *)&rd_stats_luma->field_0x24 >> 8);
      uStack_104 = *(undefined4 *)&rd_stats_luma->field_0x21;
      local_78 = CONCAT71((uint7)(uint3)((uint)uStack_104 >> 8),1);
      local_58 = 0;
      local_68 = 0;
      local_70 = 0;
      local_60 = 0;
      local_fc = 0;
      local_90 = cpi;
    }
    else {
      local_40 = &cpi->common;
      pMVar1 = &x->e_mbd;
      local_48 = pMVar1;
      local_58 = 0;
      local_90 = cpi;
      if (iVar10 == 1) {
        local_78 = CONCAT71((int7)(uVar11 >> 8),1);
        local_68 = 0;
        local_70 = 0;
        local_60 = 0;
        local_fc = 0;
      }
      else {
        if (iVar10 != 0) {
          return 0;
        }
        local_c8 = 0;
        iStack_c0 = 0;
        uStack_b8 = 0;
        iStack_b0 = 0;
        local_a8 = CONCAT71(local_a8._1_7_,1);
        local_88._0_1_ = (BLOCK_SIZE)tile_data;
        BVar6 = (BLOCK_SIZE)local_88;
        local_a0 = pMVar21;
        local_98 = orig_dst;
        local_88 = puVar24;
        av1_enc_build_inter_predictor
                  (&cpi->common,pMVar1,(x->e_mbd).mi_row,(x->e_mbd).mi_col,
                   (BUFFER_SET *)CONCAT71(in_register_00000009,bsize),BVar6,0,0);
        cpi = local_90;
        uVar20 = 0;
        (*model_rd_sb_fn[(local_90->sf).rt_sf.use_simple_rd_model == 0])
                  (local_90,BVar6,x,pMVar1,0,0,(int *)&local_c8,&iStack_c0,(uint8_t *)&local_a8,
                   &iStack_b0,(int *)0x0,(int64_t *)0x0,(int64_t *)0x0);
        if ((int)local_c8 == 0x7fffffff) {
          local_c8._0_4_ = 0x7fffffff;
          iStack_c0 = 0x7fffffffffffffff;
          local_f8 = 0x7fffffffffffffff;
          local_f0 = 0x7fffffffffffffff;
          local_78 = 0;
          local_60 = 0;
        }
        else {
          local_60 = local_c8 >> 0x20;
          local_f8 = 0;
          local_f0 = iStack_b0;
          if (iStack_b0 == 0x7fffffffffffffff) {
            local_f0 = local_f8;
          }
          local_78 = CONCAT71((int7)((ulong)uVar20 >> 8),(byte)local_a8) & 0xffffffffffffff01;
        }
        uVar13 = local_78 & 0xffffffff;
        local_70 = local_f0;
        local_68 = local_f8;
        local_58 = iStack_c0;
        local_110 = (int)local_60;
        orig_dst = local_98;
        pMVar21 = local_a0;
        local_fc = (int)local_c8;
        local_d8 = iStack_c0;
      }
      if (uVar2 == '\0') {
        uVar19 = 2;
        if (2 < uVar17) {
          uVar19 = uVar17;
        }
        plane_from = 1;
        BVar6 = (BLOCK_SIZE)local_88;
        local_4c = (uint)(BLOCK_SIZE)local_88;
        local_98 = orig_dst;
        local_a0 = pMVar21;
        lVar18 = local_d8;
        iVar10 = (int)local_c8;
        do {
          pMVar1 = local_48;
          lVar16 = lVar18 * 0x80 + ((long)x->rdmult * (long)(iVar10 + iVar22) + 0x100 >> 9);
          local_88 = orig_dst->plane[0];
          if (lVar16 < (long)local_88) {
            bVar23 = (byte)uVar13;
            uVar13 = 0;
            iStack_b0 = 0;
            iStack_c0 = 0;
            uStack_b8 = 0;
            local_a8 = CONCAT71(local_a8._1_7_,1);
            local_c8 = 0;
            av1_enc_build_inter_predictor
                      (local_40,local_48,(x->e_mbd).mi_row,(x->e_mbd).mi_col,local_38,BVar6,
                       plane_from,plane_from);
            (*model_rd_sb_fn[(local_90->sf).rt_sf.use_simple_rd_model == 0])
                      (local_90,BVar6,x,pMVar1,plane_from,plane_from,(int *)&local_c8,&iStack_c0,
                       (uint8_t *)&local_a8,&iStack_b0,(int *)0x0,(int64_t *)0x0,(int64_t *)0x0);
            orig_dst = local_98;
            pMVar21 = local_a0;
            iVar9 = 0x7fffffff;
            if (iVar10 == 0x7fffffff) {
              local_d8 = 0x7fffffffffffffff;
              iVar7 = 0;
              lVar8 = 0x7fffffffffffffff;
              lVar14 = 0x7fffffffffffffff;
            }
            else {
              uVar13 = 0;
              local_d8 = 0x7fffffffffffffff;
              iVar7 = 0;
              lVar8 = local_d8;
              lVar14 = local_d8;
              if ((long)(int)local_c8 != 0x7fffffff) {
                lVar12 = (long)(int)local_c8 + (long)iVar10;
                if (0x7ffffffe < lVar12) {
                  lVar12 = 0x7fffffff;
                }
                if (local_110 == 0) {
                  local_110 = local_c8._4_4_;
                }
                local_d8 = lVar18 + iStack_c0;
                if (iStack_b0 == 0x7fffffffffffffff) {
                  iStack_b0 = 0;
                }
                lVar14 = iStack_b0 + local_f0;
                if (local_f0 == 0x7fffffffffffffff) {
                  lVar14 = 0x7fffffffffffffff;
                }
                uVar13 = (ulong)(bVar23 & (byte)local_a8);
                iVar7 = local_110;
                lVar8 = local_f8;
                iVar9 = (int)lVar12;
              }
            }
          }
          else {
            pMVar21->interp_filters = iVar3;
            local_d8 = lVar18;
            iVar7 = local_110;
            lVar8 = local_f8;
            lVar14 = local_f0;
            iVar9 = iVar10;
          }
          local_c8._0_4_ = iVar9;
          local_f0 = lVar14;
          local_f8 = lVar8;
          local_110 = iVar7;
          if ((long)local_88 <= lVar16) {
            return 0;
          }
          plane_from = plane_from + 1;
          lVar18 = local_d8;
          iVar10 = (int)local_c8;
        } while (uVar19 != plane_from);
        local_111 = (uint8_t)uVar13;
      }
      else {
        local_111 = (uint8_t)uVar13;
        local_90 = cpi;
      }
    }
    puVar24 = (uint8_t *)
              (local_d8 * 0x80 + ((long)x->rdmult * (long)((int)local_c8 + iVar22) + 0x100 >> 9));
    if ((long)puVar24 < (long)orig_dst->plane[0]) {
      orig_dst->plane[0] = puVar24;
      rd_stats->rate = iVar22;
      if ((local_90->interp_search_flags).default_interp_skip_flags != (int)switchable_ctx) {
        if ((int)switchable_ctx == 1) {
          rd_stats_luma->rate = (int)local_c8;
          rd_stats_luma->zero_rate = local_110;
          rd_stats_luma->dist = local_d8;
          rd_stats_luma->rdcost = local_f8;
          rd_stats_luma->sse = local_f0;
          rd_stats_luma->skip_txfm = local_111;
          *(undefined4 *)&rd_stats_luma->field_0x21 = uStack_104;
          *(uint *)&rd_stats_luma->field_0x24 = CONCAT31(uStack_100,uStack_104._3_1_);
          *(byte *)&x->recalc_luma_mc_data = (byte)x->recalc_luma_mc_data ^ 1;
        }
        else if ((int)switchable_ctx == 0) {
          *(int *)local_80 = local_fc;
          *(int *)((long)local_80 + 4) = (int)local_60;
          local_80[1] = local_58;
          local_80[2] = local_68;
          local_80[3] = local_70;
          *(char *)(local_80 + 4) = (char)local_78;
          rd_stats_luma->rate = (int)local_c8;
          rd_stats_luma->zero_rate = local_110;
          rd_stats_luma->dist = local_d8;
          rd_stats_luma->rdcost = local_f8;
          rd_stats_luma->sse = local_f0;
          rd_stats_luma->skip_txfm = local_111;
          *(undefined4 *)&rd_stats_luma->field_0x21 = uStack_104;
          *(uint *)&rd_stats_luma->field_0x24 = CONCAT31(uStack_100,uStack_104._3_1_);
          x->recalc_luma_mc_data = 0;
        }
        uVar20 = *(undefined8 *)switchable_rate;
        puVar4 = *(undefined8 **)(switchable_rate + 2);
        *(undefined8 **)switchable_rate = puVar4;
        *(undefined8 *)(switchable_rate + 2) = uVar20;
        local_a8 = puVar4[4];
        uStack_b8 = puVar4[2];
        iStack_b0 = puVar4[3];
        local_c8 = *puVar4;
        iStack_c0 = puVar4[1];
        pmVar5 = (x->e_mbd).plane;
        uVar13 = 0;
        do {
          pbVar15 = &pmVar5->dst;
          pbVar15->buf = (uint8_t *)(&local_c8)[uVar13];
          pbVar15->stride = *(int *)((long)&iStack_b0 + uVar13 * 4);
          uVar13 = uVar13 + 1;
          pmVar5 = (macroblockd_plane *)(pbVar15 + 0x51);
        } while (uVar17 != uVar13);
        return 1;
      }
      return 1;
    }
    pMVar21->interp_filters = iVar3;
  }
  return 0;
}

Assistant:

static inline int64_t interpolation_filter_rd(
    MACROBLOCK *const x, const AV1_COMP *const cpi,
    const TileDataEnc *tile_data, BLOCK_SIZE bsize,
    const BUFFER_SET *const orig_dst, int64_t *const rd,
    RD_STATS *rd_stats_luma, RD_STATS *rd_stats, int *const switchable_rate,
    const BUFFER_SET *dst_bufs[2], int filter_idx, const int switchable_ctx[2],
    const int skip_pred) {
  const AV1_COMMON *cm = &cpi->common;
  const InterpSearchFlags *interp_search_flags = &cpi->interp_search_flags;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  RD_STATS this_rd_stats_luma, this_rd_stats;

  // Initialize rd_stats structures to default values.
  av1_init_rd_stats(&this_rd_stats_luma);
  this_rd_stats = *rd_stats_luma;
  const int_interpfilters last_best = mbmi->interp_filters;
  mbmi->interp_filters = filter_sets[filter_idx];
  const int tmp_rs =
      get_switchable_rate(x, mbmi->interp_filters, switchable_ctx,
                          cm->seq_params->enable_dual_filter);

  int64_t min_rd = RDCOST(x->rdmult, tmp_rs, 0);
  if (min_rd > *rd) {
    mbmi->interp_filters = last_best;
    return 0;
  }

  (void)tile_data;

  assert(skip_pred != 2);
  assert((rd_stats_luma->rate >= 0) && (rd_stats->rate >= 0));
  assert((rd_stats_luma->dist >= 0) && (rd_stats->dist >= 0));
  assert((rd_stats_luma->sse >= 0) && (rd_stats->sse >= 0));
  assert((rd_stats_luma->skip_txfm == 0) || (rd_stats_luma->skip_txfm == 1));
  assert((rd_stats->skip_txfm == 0) || (rd_stats->skip_txfm == 1));
  assert((skip_pred >= 0) &&
         (skip_pred <= interp_search_flags->default_interp_skip_flags));

  // When skip_txfm pred is equal to default_interp_skip_flags,
  // skip both luma and chroma MC.
  // For mono-chrome images:
  // num_planes = 1 and cpi->default_interp_skip_flags = 1,
  // skip_pred = 1: skip both luma and chroma
  // skip_pred = 0: Evaluate luma and as num_planes=1,
  // skip chroma evaluation
  int tmp_skip_pred =
      (skip_pred == interp_search_flags->default_interp_skip_flags)
          ? INTERP_SKIP_LUMA_SKIP_CHROMA
          : skip_pred;

  switch (tmp_skip_pred) {
    case INTERP_EVAL_LUMA_EVAL_CHROMA:
      // skip_pred = 0: Evaluate both luma and chroma.
      // Luma MC
      interp_model_rd_eval(x, cpi, bsize, orig_dst, AOM_PLANE_Y, AOM_PLANE_Y,
                           &this_rd_stats_luma, 0);
      this_rd_stats = this_rd_stats_luma;
#if CONFIG_COLLECT_RD_STATS == 3
      RD_STATS rd_stats_y;
      av1_pick_recursive_tx_size_type_yrd(cpi, x, &rd_stats_y, bsize,
                                          INT64_MAX);
      PrintPredictionUnitStats(cpi, tile_data, x, &rd_stats_y, bsize);
#endif  // CONFIG_COLLECT_RD_STATS == 3
      AOM_FALLTHROUGH_INTENDED;
    case INTERP_SKIP_LUMA_EVAL_CHROMA:
      // skip_pred = 1: skip luma evaluation (retain previous best luma stats)
      // and do chroma evaluation.
      for (int plane = 1; plane < num_planes; ++plane) {
        int64_t tmp_rd =
            RDCOST(x->rdmult, tmp_rs + this_rd_stats.rate, this_rd_stats.dist);
        if (tmp_rd >= *rd) {
          mbmi->interp_filters = last_best;
          return 0;
        }
        interp_model_rd_eval(x, cpi, bsize, orig_dst, plane, plane,
                             &this_rd_stats, 0);
      }
      break;
    case INTERP_SKIP_LUMA_SKIP_CHROMA:
      // both luma and chroma evaluation is skipped
      this_rd_stats = *rd_stats;
      break;
    case INTERP_EVAL_INVALID:
    default: assert(0); return 0;
  }
  int64_t tmp_rd =
      RDCOST(x->rdmult, tmp_rs + this_rd_stats.rate, this_rd_stats.dist);

  if (tmp_rd < *rd) {
    *rd = tmp_rd;
    *switchable_rate = tmp_rs;
    if (skip_pred != interp_search_flags->default_interp_skip_flags) {
      if (skip_pred == INTERP_EVAL_LUMA_EVAL_CHROMA) {
        // Overwrite the data as current filter is the best one
        *rd_stats_luma = this_rd_stats_luma;
        *rd_stats = this_rd_stats;
        // As luma MC data is computed, no need to recompute after the search
        x->recalc_luma_mc_data = 0;
      } else if (skip_pred == INTERP_SKIP_LUMA_EVAL_CHROMA) {
        // As luma MC data is not computed, update of luma data can be skipped
        *rd_stats = this_rd_stats;
        // As luma MC data is not recomputed and current filter is the best,
        // indicate the possibility of recomputing MC data
        // If current buffer contains valid MC data, toggle to indicate that
        // luma MC data needs to be recomputed
        x->recalc_luma_mc_data ^= 1;
      }
      swap_dst_buf(xd, dst_bufs, num_planes);
    }
    return 1;
  }
  mbmi->interp_filters = last_best;
  return 0;
}